

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O1

void shopdig(int fall)

{
  obj *poVar1;
  obj *obj;
  boolean bVar2;
  int iVar3;
  monst *mtmp;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  
  mtmp = shop_keeper(level,u.ushops[0]);
  if (mtmp != (monst *)0x0) {
    if ((*(uint *)&mtmp->field_0x60 & 0xc0000) == 0x40000) {
      bVar6 = 0x13 < mtmp->data->msound;
    }
    else {
      bVar6 = false;
    }
    iVar3 = inhishop(mtmp);
    if (iVar3 != 0) {
      if (fall != 0) {
        bVar2 = um_dist(mtmp->mx,mtmp->my,'\x05');
        if (bVar2 != '\0') {
          return;
        }
        if ((*(uint *)&mtmp->field_0x60 & 0xc0000) != 0x40000) {
          return;
        }
        if ((*(short *)((long)&mtmp[0x1b].misc_worn_check + 2) == 0) &&
           (*(int *)&mtmp[0x1b].field_0x60 == 0)) {
          return;
        }
        pcVar5 = "grabs";
        if ((~mtmp->data->mflags1 & 0x6000) == 0) {
          pcVar5 = "knocks off";
        }
        iVar3 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy);
        if (iVar3 < 3) {
          pline("%s %s your backpack!",(undefined1 *)((long)&mtmp[0x1c].minvent + 5),pcVar5);
          poVar1 = invent;
        }
        else {
          mnexto(mtmp);
          iVar3 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy);
          if (2 < iVar3) {
            if (bVar6) {
              pline("%s curses you in anger and frustration!",
                    (undefined1 *)((long)&mtmp[0x1c].minvent + 5));
            }
            rile_shk(mtmp);
            return;
          }
          pcVar4 = locomotion(mtmp->data,"leap");
          pcVar4 = makeplural(pcVar4);
          pline("%s %s, and %s your backpack!",(undefined1 *)((long)&mtmp[0x1c].minvent + 5),pcVar4,
                pcVar5);
          poVar1 = invent;
        }
        while (obj = poVar1, obj != (obj *)0x0) {
          poVar1 = obj->nobj;
          if (((((obj->owornmask & 0xfffff9ffU) == 0) && ((obj != uswapwep || (u.twoweap == '\0'))))
              && ((obj->otyp != 0xf1 || (obj->corpsenm == 0)))) && (obj != current_wand)) {
            setnotworn(obj);
            freeinv(obj);
            subfrombill(obj,mtmp);
            add_to_minv(mtmp,obj);
          }
        }
        return;
      }
      if (bVar6) {
        if (u.utraptype == 1) {
          pcVar5 = "madam";
          if (flags.female == '\0') {
            pcVar5 = "sir";
          }
          pcVar4 = "Be careful, %s, or you might fall through the floor.";
        }
        else {
          pcVar5 = "Madam";
          if (flags.female == '\0') {
            pcVar5 = "Sir";
          }
          pcVar4 = "%s, do not damage the floor here!";
        }
        verbalize(pcVar4,pcVar5);
      }
    }
    if (urole.malenum == 0x15f) {
      pline("You feel like a common thief.");
      iVar3 = sgn((int)u.ualign.type);
      adjalign(-iVar3);
      return;
    }
  }
  return;
}

Assistant:

void shopdig(int fall)
{
    struct monst *shkp = shop_keeper(level, *u.ushops);
    int lang;
    const char *grabs = "grabs";

    if (!shkp) return;

    /* 0 == can't speak, 1 == makes animal noises, 2 == speaks */
    lang = 0;
    if (shkp->msleeping || !shkp->mcanmove || is_silent(shkp->data))
	;	/* lang stays 0 */
    else if (shkp->data->msound <= MS_ANIMAL)
	lang = 1;
    else if (shkp->data->msound >= MS_HUMANOID)
	lang = 2;

    if (!inhishop(shkp)) {
	if (Role_if (PM_KNIGHT)) {
	    pline("You feel like a common thief.");
	    adjalign(-sgn(u.ualign.type));
	}
	return;
    }

    if (!fall) {
	if (lang == 2) {
	    if (u.utraptype == TT_PIT)
		verbalize(
			"Be careful, %s, or you might fall through the floor.",
			flags.female ? "madam" : "sir");
	    else
		verbalize("%s, do not damage the floor here!",
			flags.female ? "Madam" : "Sir");
	}
	if (Role_if (PM_KNIGHT)) {
	    pline("You feel like a common thief.");
	    adjalign(-sgn(u.ualign.type));
	}
    } else if (!um_dist(shkp->mx, shkp->my, 5) &&
		!shkp->msleeping && shkp->mcanmove &&
		(ESHK(shkp)->billct || ESHK(shkp)->debit)) {
	    struct obj *obj, *obj2;
	    if (nolimbs(shkp->data)) {
		grabs = "knocks off";
	    }
	    if (distu(shkp->mx, shkp->my) > 2) {
		mnexto(shkp);
		/* for some reason the shopkeeper can't come next to you */
		if (distu(shkp->mx, shkp->my) > 2) {
		    if (lang == 2)
			pline("%s curses you in anger and frustration!",
			      shkname(shkp));
		    rile_shk(shkp);
		    return;
		} else
		    pline("%s %s, and %s your backpack!",
			  shkname(shkp),
			  makeplural(locomotion(shkp->data,"leap")), grabs);
	    } else
		pline("%s %s your backpack!", shkname(shkp), grabs);

	    for (obj = invent; obj; obj = obj2) {
		obj2 = obj->nobj;
		if ((obj->owornmask & ~(W_SWAPWEP|W_QUIVER)) != 0 ||
			(obj == uswapwep && u.twoweap) ||
			(obj->otyp == LEASH && obj->leashmon)) continue;
		if (obj == current_wand) continue;
		setnotworn(obj);
		freeinv(obj);
		subfrombill(obj, shkp);
		add_to_minv(shkp, obj);	/* may free obj */
	    }
    }
}